

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O3

void tool_list_engines(CURL *curl)

{
  curl_slist *engines;
  undefined8 *local_18;
  
  local_18 = (undefined8 *)0x0;
  curl_easy_getinfo(curl,0x40001b,&local_18);
  puts("Build-time engines:");
  if (local_18 == (undefined8 *)0x0) {
    puts("  <none>");
  }
  else {
    do {
      printf("  %s\n",*local_18);
      local_18 = (undefined8 *)local_18[1];
    } while (local_18 != (undefined8 *)0x0);
    local_18 = (undefined8 *)0x0;
  }
  curl_slist_free_all(local_18);
  return;
}

Assistant:

void tool_list_engines(CURL *curl)
{
  struct curl_slist *engines = NULL;

  /* Get the list of engines */
  curl_easy_getinfo(curl, CURLINFO_SSL_ENGINES, &engines);

  puts("Build-time engines:");
  if(engines) {
    for(; engines; engines = engines->next)
      printf("  %s\n", engines->data);
  }
  else {
    puts("  <none>");
  }

  /* Cleanup the list of engines */
  curl_slist_free_all(engines);
}